

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_time_cmp(mbedtls_x509_time *t1,mbedtls_x509_time *t2)

{
  int x;
  mbedtls_x509_time *t2_local;
  mbedtls_x509_time *t1_local;
  
  t1_local._4_4_ =
       (t1->year << 9 | t1->mon << 5 | t1->day) - (t2->year << 9 | t2->mon << 5 | t2->day);
  if (t1_local._4_4_ == 0) {
    t1_local._4_4_ =
         (t1->hour << 0xc | t1->min << 6 | t1->sec) - (t2->hour << 0xc | t2->min << 6 | t2->sec);
  }
  return t1_local._4_4_;
}

Assistant:

int mbedtls_x509_time_cmp(const mbedtls_x509_time *t1,
                          const mbedtls_x509_time *t2)
{
    int x;

    x = (((t1->year << 9) | (t1->mon << 5) | (t1->day)) -
         ((t2->year << 9) | (t2->mon << 5) | (t2->day)));
    if (x != 0) {
        return x;
    }

    x = (((t1->hour << 12) | (t1->min << 6) | (t1->sec)) -
         ((t2->hour << 12) | (t2->min << 6) | (t2->sec)));
    return x;
}